

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

ssize_t Bcj2_Decode(_7zip *zip,uint8_t *outBuf,size_t outSize)

{
  size_t *psVar1;
  byte bVar2;
  uchar uVar3;
  ushort uVar4;
  uchar *puVar5;
  uchar *puVar6;
  size_t sVar7;
  uchar *puVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  int iVar12;
  uint *puVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  uint16_t *puVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint8_t out [4];
  uint8_t local_7c [4];
  byte *local_78;
  uint *local_70;
  uint *local_68;
  ulong local_60;
  ulong local_58;
  byte *local_50;
  size_t local_48;
  uchar *local_40;
  uint16_t *local_38;
  
  local_48 = zip->tmp_stream_bytes_remaining;
  puVar5 = zip->tmp_stream_buff;
  sVar15 = zip->tmp_stream_bytes_avail;
  local_58 = zip->sub_stream_bytes_remaining[0];
  puVar6 = zip->sub_stream_buff[0];
  sVar7 = zip->sub_stream_size[0];
  puVar8 = zip->sub_stream_buff[1];
  local_60 = zip->sub_stream_bytes_remaining[1];
  sVar9 = zip->sub_stream_bytes_remaining[2];
  local_50 = zip->sub_stream_buff[2] + zip->sub_stream_size[2];
  local_78 = local_50 + -sVar9;
  sVar10 = zip->sub_stream_size[1];
  if (zip->bcj_state == 0) {
    zip->bcj2_prevByte = '\0';
    auVar11 = _DAT_008ff720;
    lVar18 = 0;
    auVar25 = _DAT_0098a640;
    auVar26 = _DAT_0098a650;
    auVar27 = _DAT_008ff700;
    auVar28 = _DAT_008ff710;
    do {
      auVar29 = auVar28 ^ auVar11;
      iVar12 = auVar29._0_4_;
      iVar34 = auVar29._8_4_;
      auVar35._4_4_ = iVar12;
      auVar35._0_4_ = iVar12;
      auVar35._8_4_ = iVar34;
      auVar35._12_4_ = iVar34;
      auVar39._0_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar39._4_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar39._8_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar39._12_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar30._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar30._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar30._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar30._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar30 = auVar30 & auVar39;
      auVar29 = pshuflw(auVar35,auVar30,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18] = 0x400;
      }
      auVar29 = packssdw(auVar30,auVar30);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
        zip->bcj2_p[lVar18 + 1] = 0x400;
      }
      auVar29 = auVar27 ^ auVar11;
      iVar12 = auVar29._0_4_;
      iVar34 = auVar29._8_4_;
      auVar36._4_4_ = iVar12;
      auVar36._0_4_ = iVar12;
      auVar36._8_4_ = iVar34;
      auVar36._12_4_ = iVar34;
      auVar40._0_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar40._4_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar40._8_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar40._12_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar31._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar31._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar31._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar31._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar31 = auVar31 & auVar40;
      auVar29 = packssdw(auVar36,auVar31);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18 + 2] = 0x400;
      }
      auVar29 = pshufhw(auVar31,auVar31,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18 + 3] = 0x400;
      }
      auVar29 = auVar26 ^ auVar11;
      iVar12 = auVar29._0_4_;
      iVar34 = auVar29._8_4_;
      auVar37._4_4_ = iVar12;
      auVar37._0_4_ = iVar12;
      auVar37._8_4_ = iVar34;
      auVar37._12_4_ = iVar34;
      auVar41._0_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar41._4_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar41._8_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar41._12_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar32._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar32._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar32._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar32._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar32 = auVar32 & auVar41;
      auVar29 = pshuflw(auVar37,auVar32,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18 + 4] = 0x400;
      }
      auVar29 = packssdw(auVar32,auVar32);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18 + 5] = 0x400;
      }
      auVar29 = auVar25 ^ auVar11;
      iVar12 = auVar29._0_4_;
      iVar34 = auVar29._8_4_;
      auVar38._4_4_ = iVar12;
      auVar38._0_4_ = iVar12;
      auVar38._8_4_ = iVar34;
      auVar38._12_4_ = iVar34;
      auVar42._0_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar42._4_4_ = -(uint)(iVar12 < -0x7ffffefe);
      auVar42._8_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar42._12_4_ = -(uint)(iVar34 < -0x7ffffefe);
      auVar33._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar33._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar33._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar33._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar33 = auVar33 & auVar42;
      auVar29 = packssdw(auVar38,auVar33);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18 + 6] = 0x400;
      }
      auVar29 = pshufhw(auVar33,auVar33,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar18 + 7] = 0x400;
      }
      lVar18 = lVar18 + 8;
      lVar24 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 8;
      auVar28._8_8_ = lVar24 + 8;
      lVar24 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 8;
      auVar27._8_8_ = lVar24 + 8;
      lVar24 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 8;
      auVar26._8_8_ = lVar24 + 8;
      lVar24 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 8;
      auVar25._8_8_ = lVar24 + 8;
    } while (lVar18 != 0x108);
    zip->bcj2_range = 0xffffffff;
    zip->bcj2_code = 0;
    sVar19 = 0;
    uVar21 = 0;
    do {
      if (sVar9 == sVar19) {
        return -0x19;
      }
      uVar21 = uVar21 << 8 | (uint)local_78[sVar19];
      zip->bcj2_code = uVar21;
      sVar19 = sVar19 + 1;
    } while ((int)sVar19 != 5);
    zip->bcj_state = 1;
    local_78 = local_78 + sVar19;
  }
  uVar17 = 0;
  if (outSize == 0 || zip->odd_bcj_size == 0) {
    if (outSize == 0) goto LAB_007aab1f;
  }
  else {
    do {
      outBuf[uVar17] = zip->odd_bcj[uVar17 & 0xffffffff];
      uVar17 = uVar17 + 1;
      psVar1 = &zip->odd_bcj_size;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
    } while (uVar17 < outSize);
  }
  lVar18 = sVar15 - local_48;
  local_70 = (uint *)(puVar6 + (sVar7 - local_58));
  local_68 = (uint *)(puVar8 + (sVar10 - local_60));
  local_38 = zip->bcj2_p;
  local_40 = zip->odd_bcj;
  lVar24 = 0;
  do {
    uVar16 = outSize - uVar17;
    if (local_48 - lVar24 <= outSize - uVar17) {
      uVar16 = local_48 - lVar24;
    }
    if ((zip->bcj_state == 1) && (uVar16 != 0)) {
      while( true ) {
        bVar2 = puVar5[lVar24 + lVar18];
        outBuf[uVar17] = bVar2;
        uVar17 = uVar17 + 1;
        if (((bVar2 & 0xfe) == 0xe8) || (((bVar2 & 0xf0) == 0x80 && (zip->bcj2_prevByte == '\x0f')))
           ) break;
        lVar24 = lVar24 + 1;
        zip->bcj2_prevByte = bVar2;
        uVar16 = uVar16 - 1;
        if (uVar16 == 0) goto LAB_007aaaef;
      }
      zip->bcj_state = 2;
      uVar16 = 1;
    }
    if ((uVar17 == outSize) || (uVar16 == 0)) goto LAB_007aaaef;
    zip->bcj_state = 1;
    uVar3 = puVar5[lVar24 + lVar18];
    if (uVar3 == 0xe8) {
      puVar20 = local_38 + zip->bcj2_prevByte;
    }
    else {
      puVar20 = (uint16_t *)(zip->format_name + (ulong)(uVar3 != 0xe9) * 2 + -0x20);
    }
    uVar4 = *puVar20;
    uVar21 = zip->bcj2_code;
    uVar23 = (zip->bcj2_range >> 0xb) * (uint)uVar4;
    if (uVar21 < uVar23) {
      zip->bcj2_range = uVar23;
      *puVar20 = (short)(0x800 - uVar4 >> 5) + uVar4;
      if (uVar23 < 0x1000000) {
        if (local_78 == local_50) {
          return -0x19;
        }
        zip->bcj2_range = uVar23 * 0x100;
        bVar2 = *local_78;
        local_78 = local_78 + 1;
        zip->bcj2_code = (uint)bVar2 | uVar21 << 8;
      }
      zip->bcj2_prevByte = uVar3;
      iVar12 = 0;
    }
    else {
      uVar22 = zip->bcj2_range - uVar23;
      zip->bcj2_range = uVar22;
      zip->bcj2_code = uVar21 - uVar23;
      *puVar20 = uVar4 - (uVar4 >> 5);
      if (uVar22 < 0x1000000) {
        if (local_78 == local_50) {
          iVar12 = 1;
          goto LAB_007aaad8;
        }
        zip->bcj2_range = uVar22 * 0x100;
        bVar2 = *local_78;
        local_78 = local_78 + 1;
        zip->bcj2_code = (uint)bVar2 | (uVar21 - uVar23) * 0x100;
      }
      if (uVar3 == 0xe8) {
        iVar12 = 1;
        if (3 < local_58) {
          local_58 = local_58 - 4;
          puVar13 = local_70;
          local_70 = local_70 + 1;
LAB_007aaa0d:
          uVar21 = *puVar13;
          iVar12 = ((uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18) - ((int)zip->bcj2_outPos + (int)uVar17)) + -4;
          local_7c[0] = (uint8_t)iVar12;
          local_7c[1] = (uint8_t)((uint)iVar12 >> 8);
          local_7c[2] = (uint8_t)((uint)iVar12 >> 0x10);
          local_7c[3] = (uint8_t)((uint)iVar12 >> 0x18);
          zip->bcj2_prevByte = local_7c[3];
          if (uVar17 < outSize) {
            uVar16 = ~uVar17 + outSize;
            if (2 < uVar16) {
              uVar16 = 3;
            }
            memcpy(outBuf + uVar17,local_7c,uVar16 + 1);
            uVar16 = 0;
            do {
              uVar14 = uVar16;
              uVar16 = uVar14 + 1;
              if (2 < uVar14) break;
            } while (uVar14 + uVar17 + 1 < outSize);
            uVar17 = uVar17 + uVar16;
            if (2 < uVar14) {
              iVar12 = 0;
              goto LAB_007aaad8;
            }
            sVar15 = 4 - uVar16;
          }
          else {
            uVar16 = 0;
            sVar15 = 4;
          }
          zip->odd_bcj_size = sVar15;
          memcpy(local_40,local_7c + (uVar16 & 0xffffffff),(ulong)(4 - (int)uVar16));
          iVar12 = 0xb;
        }
      }
      else {
        iVar12 = 1;
        if (3 < local_60) {
          local_60 = local_60 - 4;
          puVar13 = local_68;
          local_68 = local_68 + 1;
          goto LAB_007aaa0d;
        }
      }
    }
LAB_007aaad8:
    lVar24 = lVar24 + 1;
  } while (iVar12 == 0);
  if (iVar12 != 0xb) {
    return -0x19;
  }
LAB_007aaaef:
  zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_remaining - lVar24;
  zip->sub_stream_bytes_remaining[0] = local_58;
  zip->sub_stream_bytes_remaining[1] = local_60;
  zip->sub_stream_bytes_remaining[2] = (long)local_50 - (long)local_78;
LAB_007aab1f:
  zip->bcj2_outPos = zip->bcj2_outPos + uVar17;
  return uVar17;
}

Assistant:

static ssize_t
Bcj2_Decode(struct _7zip *zip, uint8_t *outBuf, size_t outSize)
{
	size_t inPos = 0, outPos = 0;
	const uint8_t *buf0, *buf1, *buf2, *buf3;
	size_t size0, size1, size2, size3;
	const uint8_t *buffer, *bufferLim;
	unsigned int i, j;

	size0 = zip->tmp_stream_bytes_remaining;
	buf0 = zip->tmp_stream_buff + zip->tmp_stream_bytes_avail - size0;
	size1 = zip->sub_stream_bytes_remaining[0];
	buf1 = zip->sub_stream_buff[0] + zip->sub_stream_size[0] - size1;
	size2 = zip->sub_stream_bytes_remaining[1];
	buf2 = zip->sub_stream_buff[1] + zip->sub_stream_size[1] - size2;
	size3 = zip->sub_stream_bytes_remaining[2];
	buf3 = zip->sub_stream_buff[2] + zip->sub_stream_size[2] - size3;

	buffer = buf3;
	bufferLim = buffer + size3;

	if (zip->bcj_state == 0) {
		/*
		 * Initialize.
		 */
		zip->bcj2_prevByte = 0;
		for (i = 0;
		    i < sizeof(zip->bcj2_p) / sizeof(zip->bcj2_p[0]); i++)
			zip->bcj2_p[i] = kBitModelTotal >> 1;
		RC_INIT2;
		zip->bcj_state = 1;
	}

	/*
	 * Gather the odd bytes of a previous call.
	 */
	for (i = 0; zip->odd_bcj_size > 0 && outPos < outSize; i++) {
		outBuf[outPos++] = zip->odd_bcj[i];
		zip->odd_bcj_size--;
	}

	if (outSize == 0) {
		zip->bcj2_outPos += outPos;
		return (outPos);
	}

	for (;;) {
		uint8_t b;
		CProb *prob;
		uint32_t bound;
		uint32_t ttt;

		size_t limit = size0 - inPos;
		if (outSize - outPos < limit)
			limit = outSize - outPos;

		if (zip->bcj_state == 1) {
			while (limit != 0) {
				uint8_t bb = buf0[inPos];
				outBuf[outPos++] = bb;
				if (IsJ(zip->bcj2_prevByte, bb)) {
					zip->bcj_state = 2;
					break;
				}
				inPos++;
				zip->bcj2_prevByte = bb;
				limit--;
			}
		}

		if (limit == 0 || outPos == outSize)
			break;
		zip->bcj_state = 1;

		b = buf0[inPos++];

		if (b == 0xE8)
			prob = zip->bcj2_p + zip->bcj2_prevByte;
		else if (b == 0xE9)
			prob = zip->bcj2_p + 256;
		else
			prob = zip->bcj2_p + 257;

		IF_BIT_0(prob) {
			UPDATE_0(prob)
			zip->bcj2_prevByte = b;
		} else {
			uint32_t dest;
			const uint8_t *v;
			uint8_t out[4];

			UPDATE_1(prob)
			if (b == 0xE8) {
				v = buf1;
				if (size1 < 4)
					return SZ_ERROR_DATA;
				buf1 += 4;
				size1 -= 4;
			} else {
				v = buf2;
				if (size2 < 4)
					return SZ_ERROR_DATA;
				buf2 += 4;
				size2 -= 4;
			}
			dest = (((uint32_t)v[0] << 24) |
			    ((uint32_t)v[1] << 16) |
			    ((uint32_t)v[2] << 8) |
			    ((uint32_t)v[3])) -
			    ((uint32_t)zip->bcj2_outPos + (uint32_t)outPos + 4);
			out[0] = (uint8_t)dest;
			out[1] = (uint8_t)(dest >> 8);
			out[2] = (uint8_t)(dest >> 16);
			out[3] = zip->bcj2_prevByte = (uint8_t)(dest >> 24);

			for (i = 0; i < 4 && outPos < outSize; i++)
				outBuf[outPos++] = out[i];
			if (i < 4) {
				/*
				 * Save odd bytes which we could not add into
				 * the output buffer because of out of space.
				 */
				zip->odd_bcj_size = 4 -i;
				for (; i < 4; i++) {
					j = i - 4 + (unsigned)zip->odd_bcj_size;
					zip->odd_bcj[j] = out[i];
				}
				break;
			}
		}
	}